

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O0

LPVOID VirtualAlloc_(LPVOID lpAddress,SIZE_T dwSize,DWORD flAllocationType,DWORD flProtect)

{
  int iVar1;
  BOOL BVar2;
  CPalThread *pThread;
  CPalThread *pthrCurrent;
  LPVOID pRetVal;
  DWORD flProtect_local;
  DWORD flAllocationType_local;
  SIZE_T dwSize_local;
  LPVOID lpAddress_local;
  
  if ((VirtualAlloc_(void*,unsigned_long,unsigned_int,unsigned_int)::was_pal_initialized == '\0') &&
     (iVar1 = __cxa_guard_acquire(&VirtualAlloc_(void*,unsigned_long,unsigned_int,unsigned_int)::
                                   was_pal_initialized), iVar1 != 0)) {
    VirtualAlloc_::was_pal_initialized = PAL_Initialize_Check_Once();
    __cxa_guard_release(&VirtualAlloc_(void*,unsigned_long,unsigned_int,unsigned_int)::
                         was_pal_initialized);
  }
  if ((VirtualAlloc_::was_pal_initialized & 1U) == 0) {
    fprintf(_stderr,"] %s %s:%d","VirtualAlloc_",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
            ,0x6b3);
    fprintf(_stderr,"Expression: was_pal_initialized\n");
  }
  pthrCurrent = (CPalThread *)0x0;
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  pThread = CorUnix::InternalGetCurrentThread();
  if ((flAllocationType & 0x200000) == 0) {
    if ((flAllocationType & 0xbfefcfff) == 0) {
      BVar2 = VIRTUALContainsInvalidProtectionFlags(flProtect);
      if (BVar2 == 0) {
        if (((flAllocationType & 0x100000) != 0) && ((PAL_InitializeChakraCoreCalled & 1U) == 0)) {
          abort();
        }
        if ((flAllocationType & 0x2000) != 0) {
          CorUnix::InternalEnterCriticalSection(pThread,&virtual_critsec);
          pthrCurrent = (CPalThread *)
                        VIRTUALReserveMemory(pThread,lpAddress,dwSize,flAllocationType,flProtect);
          CorUnix::InternalLeaveCriticalSection(pThread,&virtual_critsec);
          if (pthrCurrent == (CPalThread *)0x0) goto LAB_003a9fd3;
        }
        if ((flAllocationType & 0x1000) != 0) {
          CorUnix::InternalEnterCriticalSection(pThread,&virtual_critsec);
          if (pthrCurrent == (CPalThread *)0x0) {
            pthrCurrent = (CPalThread *)
                          VIRTUALCommitMemory(pThread,lpAddress,dwSize,flAllocationType,flProtect);
          }
          else {
            pthrCurrent = (CPalThread *)
                          VIRTUALCommitMemory(pThread,pthrCurrent,dwSize,flAllocationType,flProtect)
            ;
          }
          CorUnix::InternalLeaveCriticalSection(pThread,&virtual_critsec);
        }
      }
      else {
        fprintf(_stderr,"] %s %s:%d","VirtualAlloc_",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
                ,0x6d0);
        fprintf(_stderr,
                "flProtect can be one of PAGE_READONLY, PAGE_READWRITE, or                PAGE_EXECUTE_READWRITE || PAGE_NOACCESS. \n"
               );
        CorUnix::CPalThread::SetLastError(0x57);
      }
    }
    else {
      fprintf(_stderr,"] %s %s:%d","VirtualAlloc_",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
              ,0x6c9);
      fprintf(_stderr,
              "flAllocationType can be one, or any combination of MEM_COMMIT,                MEM_RESERVE, MEM_TOP_DOWN, or MEM_RESERVE_EXECUTABLE.\n"
             );
      CorUnix::CPalThread::SetLastError(0x57);
    }
  }
  else {
    CorUnix::CPalThread::SetLastError(0x57);
  }
LAB_003a9fd3:
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return pthrCurrent;
  }
  abort();
}

Assistant:

LPVOID
VirtualAlloc_(
         IN LPVOID lpAddress,       /* Region to reserve or commit */
         IN SIZE_T dwSize,          /* Size of Region */
         IN DWORD flAllocationType, /* Type of allocation */
         IN DWORD flProtect)        /* Type of access protection */
{
#ifdef DEBUG
    static bool was_pal_initialized = PAL_Initialize_Check_Once();
    _ASSERTE(was_pal_initialized);
#endif

    LPVOID  pRetVal       = NULL;
    CPalThread *pthrCurrent;

    PERF_ENTRY(VirtualAlloc);
    ENTRY("VirtualAlloc(lpAddress=%p, dwSize=%u, flAllocationType=%#x, \
          flProtect=%#x)\n", lpAddress, dwSize, flAllocationType, flProtect);

    pthrCurrent = InternalGetCurrentThread();

    if ( ( flAllocationType & MEM_WRITE_WATCH )  != 0 )
    {
        pthrCurrent->SetLastError( ERROR_INVALID_PARAMETER );
        goto done;
    }

    /* Test for un-supported flags. */
    if ( ( flAllocationType & ~( MEM_COMMIT | MEM_RESERVE | MEM_TOP_DOWN | MEM_RESERVE_EXECUTABLE ) ) != 0 )
    {
        ASSERT( "flAllocationType can be one, or any combination of MEM_COMMIT, \
               MEM_RESERVE, MEM_TOP_DOWN, or MEM_RESERVE_EXECUTABLE.\n" );
        pthrCurrent->SetLastError( ERROR_INVALID_PARAMETER );
        goto done;
    }
    if ( VIRTUALContainsInvalidProtectionFlags( flProtect ) )
    {
        ASSERT( "flProtect can be one of PAGE_READONLY, PAGE_READWRITE, or \
               PAGE_EXECUTE_READWRITE || PAGE_NOACCESS. \n" );

        pthrCurrent->SetLastError( ERROR_INVALID_PARAMETER );
        goto done;
    }
    if ( flAllocationType & MEM_TOP_DOWN )
    {
        WARN( "Ignoring the allocation flag MEM_TOP_DOWN.\n" );
    }

#if RESERVE_FROM_BACKING_FILE
    // Make sure we have memory to map before we try to use it.
    VIRTUALGetBackingFile(pthrCurrent);
#endif  // RESERVE_FROM_BACKING_FILE

    if ( flAllocationType & MEM_RESERVE )
    {
        InternalEnterCriticalSection(pthrCurrent, &virtual_critsec);
        pRetVal = VIRTUALReserveMemory( pthrCurrent, lpAddress, dwSize, flAllocationType, flProtect );
        InternalLeaveCriticalSection(pthrCurrent, &virtual_critsec);

        if ( !pRetVal )
        {
            /* Error messages are already displayed, just leave. */
            goto done;
        }
    }

    if ( flAllocationType & MEM_COMMIT )
    {
        InternalEnterCriticalSection(pthrCurrent, &virtual_critsec);
        if ( pRetVal != NULL )
        {
            /* We are reserving and committing. */
            pRetVal = VIRTUALCommitMemory( pthrCurrent, pRetVal, dwSize,
                                    flAllocationType, flProtect );
        }
        else
        {
            /* Just a commit. */
            pRetVal = VIRTUALCommitMemory( pthrCurrent, lpAddress, dwSize,
                                    flAllocationType, flProtect );
        }
        InternalLeaveCriticalSection(pthrCurrent, &virtual_critsec);
    }

done:
    LOGEXIT("VirtualAlloc returning %p\n ", pRetVal  );
    PERF_EXIT(VirtualAlloc);
    return pRetVal;
}